

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaDeviceIndex Pa_GetDefaultOutputDevice(void)

{
  PaHostApiIndex PVar1;
  PaDeviceIndex local_10;
  PaDeviceIndex result;
  PaHostApiIndex hostApi;
  
  PVar1 = Pa_GetDefaultHostApi();
  if (PVar1 < 0) {
    local_10 = -1;
  }
  else {
    local_10 = (hostApis_[PVar1]->info).defaultOutputDevice;
  }
  return local_10;
}

Assistant:

PaDeviceIndex Pa_GetDefaultOutputDevice( void )
{
    PaHostApiIndex hostApi;
    PaDeviceIndex result;

    PA_LOGAPI_ENTER( "Pa_GetDefaultOutputDevice" );

    hostApi = Pa_GetDefaultHostApi();
    if( hostApi < 0 )
    {
        result = paNoDevice;
    }
    else
    {
        result = hostApis_[hostApi]->info.defaultOutputDevice;
    }

    PA_LOGAPI_EXIT_T( "Pa_GetDefaultOutputDevice", "PaDeviceIndex: %d", result );

    return result;
}